

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void iutest::TestEnv::ReleaseGlobalTestEnvironment(void)

{
  Environment *pEVar1;
  Variable *pVVar2;
  iterator __position;
  
  pVVar2 = get_vars();
  __position._M_current =
       (pVVar2->m_environment_list).
       super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    pVVar2 = get_vars();
    if (__position._M_current ==
        (pVVar2->m_environment_list).
        super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    pEVar1 = *__position._M_current;
    pVVar2 = get_vars();
    __position = std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::erase
                           (&pVVar2->m_environment_list,__position._M_current);
    if (pEVar1 != (Environment *)0x0) {
      (**(code **)(*(long *)pEVar1 + 8))(pEVar1);
    }
  }
  return;
}

Assistant:

static iuEnvironmentList& environments() { return get_vars().m_environment_list; }